

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O3

bool __thiscall BamTools::Internal::BamFtp::Seek(BamFtp *this,int64_t *position,int origin)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = (*(this->super_IBamIODevice)._vptr_IBamIODevice[10])();
  if ((char)iVar2 == '\0') {
LAB_001489e5:
    bVar1 = false;
  }
  else {
    TcpSocket::DisconnectFromHost(this->m_dataSocket);
    TcpSocket::DisconnectFromHost(this->m_commandSocket);
    if (origin == 0) {
      this->m_filePosition = *position;
    }
    else {
      if (origin != 1) goto LAB_001489e5;
      this->m_filePosition = this->m_filePosition + *position;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool BamFtp::Seek(const int64_t& position, const int origin) {

    // if FTP device not in a valid state
    if ( !IsOpen() ) {
        // TODO: set error string
        return false;
    }

    // ----------------------
    // UGLY !! but works??
    // ----------------------
    // disconnect from server
    m_dataSocket->DisconnectFromHost();
    m_commandSocket->DisconnectFromHost();

    // update file position & return success
    if ( origin == SEEK_CUR )
        m_filePosition += position;
    else if ( origin == SEEK_SET)
        m_filePosition = position;
    else {
        // TODO: set error string
        return false;
    }
    return true;
}